

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::OperationContext::OperationContext
          (OperationContext *this,Context *context,PipelineCacheData *pipelineCacheData,
          DeviceInterface *vk,VkDevice device,Allocator *allocator)

{
  InstanceInterface *pIVar1;
  VkPhysicalDevice pVVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  PipelineCacheData *pipelineCacheData_local;
  Context *context_local;
  OperationContext *this_local;
  
  pIVar1 = Context::getInstanceInterface(context);
  this->m_vki = pIVar1;
  this->m_vk = vk;
  pVVar2 = Context::getPhysicalDevice(context);
  this->m_physicalDevice = pVVar2;
  this->m_device = device;
  this->m_allocator = allocator;
  pPVar3 = Context::getBinaryCollection(context);
  this->m_progCollection = pPVar3;
  this->m_pipelineCacheData = pipelineCacheData;
  pvVar4 = Context::getDeviceExtensions_abi_cxx11_(context);
  this->m_deviceExtensions = pvVar4;
  return;
}

Assistant:

OperationContext::OperationContext (Context& context, PipelineCacheData& pipelineCacheData, const DeviceInterface& vk, const VkDevice device, vk::Allocator& allocator)
	: m_vki					(context.getInstanceInterface())
	, m_vk					(vk)
	, m_physicalDevice		(context.getPhysicalDevice())
	, m_device				(device)
	, m_allocator			(allocator)
	, m_progCollection		(context.getBinaryCollection())
	, m_pipelineCacheData	(pipelineCacheData)
	, m_deviceExtensions	(context.getDeviceExtensions())
{
}